

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int ConnectRPLIDARx(RPLIDAR *pRPLIDAR,char *szCfgFilePath)

{
  int iVar1;
  void **ppvVar2;
  long lVar3;
  _Deque_base<double,_std::allocator<double>_> local_78;
  
  ppvVar2 = addrsRPLIDAR;
  lVar3 = 0;
  do {
    if (*ppvVar2 == (void *)0x0) {
      iVar1 = ConnectRPLIDAR(pRPLIDAR,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(&local_78,0);
      std::deque<double,_std::allocator<double>_>::_M_move_assign1
                ((deque<double,_std::allocator<double>_> *)((long)anglesvectorRPLIDAR - lVar3));
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_78);
      local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(&local_78,0);
      std::deque<double,_std::allocator<double>_>::_M_move_assign1
                ((deque<double,_std::allocator<double>_> *)((long)distancesvectorRPLIDAR - lVar3),
                 &local_78);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_78);
      *ppvVar2 = pRPLIDAR;
      return 0;
    }
    lVar3 = lVar3 + -0x50;
    ppvVar2 = ppvVar2 + 1;
  } while (lVar3 != -0x500);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectRPLIDARx(RPLIDAR* pRPLIDAR, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectRPLIDAR(pRPLIDAR, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

#ifdef __cplusplus
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
#endif // __cplusplus

	addrsRPLIDAR[id] = pRPLIDAR;

	return EXIT_SUCCESS;
}